

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

void __thiscall
pbrt::
InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
::reserve(InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
          *this,size_t n)

{
  size_t sVar1;
  ParsedParameter **ppPVar2;
  iterator ppPVar3;
  ulong in_RSI;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDI;
  int i;
  ParsedParameter **ra;
  ParsedParameter **in_stack_ffffffffffffffc8;
  polymorphic_allocator<pbrt::ParsedParameter_*> *in_stack_ffffffffffffffd0;
  int local_1c;
  
  sVar1 = capacity(in_RDI);
  if (sVar1 < in_RSI) {
    ppPVar2 = pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter*>::
              allocate_object<pbrt::ParsedParameter*>
                        (in_stack_ffffffffffffffd0,(size_t)in_stack_ffffffffffffffc8);
    for (local_1c = 0; (ulong)(long)local_1c < in_RDI->nStored; local_1c = local_1c + 1) {
      in_stack_ffffffffffffffd0 =
           (polymorphic_allocator<pbrt::ParsedParameter_*> *)(ppPVar2 + local_1c);
      ppPVar3 = begin(in_RDI);
      pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter*>::
      construct<pbrt::ParsedParameter*,pbrt::ParsedParameter*>
                ((polymorphic_allocator<pbrt::ParsedParameter*> *)in_RDI,
                 (ParsedParameter **)in_stack_ffffffffffffffd0,ppPVar3 + local_1c);
      ppPVar3 = begin(in_RDI);
      pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter*>::destroy<pbrt::ParsedParameter*>
                ((polymorphic_allocator<pbrt::ParsedParameter*> *)in_RDI,ppPVar3 + local_1c);
    }
    pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter*>::
    deallocate_object<pbrt::ParsedParameter*>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0x756e35);
    in_RDI->nAlloc = in_RSI;
    in_RDI->ptr = ppPVar2;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (capacity() >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }